

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatValue(sqlite3_context *context)

{
  sqlite3_str *p;
  _func_void_void_ptr *xDel;
  char *in_RDI;
  char *zText;
  sqlite3_str *pAccum;
  sqlite3_context *in_stack_ffffffffffffffe8;
  
  p = (sqlite3_str *)sqlite3_aggregate_context(in_stack_ffffffffffffffe8,0);
  if (p != (sqlite3_str *)0x0) {
    if (p->accError == '\x12') {
      sqlite3_result_error_toobig((sqlite3_context *)0x1dd8da);
    }
    else if (p->accError == '\a') {
      sqlite3_result_error_nomem((sqlite3_context *)0x1dd8f4);
    }
    else {
      xDel = (_func_void_void_ptr *)sqlite3_str_value(p);
      sqlite3_result_text((sqlite3_context *)zText,in_RDI,(int)((ulong)p >> 0x20),xDel);
    }
  }
  return;
}

Assistant:

static void groupConcatValue(sqlite3_context *context){
  sqlite3_str *pAccum;
  pAccum = (sqlite3_str*)sqlite3_aggregate_context(context, 0);
  if( pAccum ){
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else{    
      const char *zText = sqlite3_str_value(pAccum);
      sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
    }
  }
}